

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

void Pdr_SetPrintStr(Vec_Str_t *vStr,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  char cVar1;
  int iVar2;
  char *pBuffer;
  int local_38;
  int Entry;
  int k;
  int i;
  char *pBuff;
  Vec_Int_t *vFlopCounts_local;
  int nRegs_local;
  Pdr_Set_t *p_local;
  Vec_Str_t *vStr_local;
  
  local_38 = 0;
  pBuffer = (char *)malloc((long)(nRegs + 1));
  for (Entry = 0; Entry < nRegs; Entry = Entry + 1) {
    pBuffer[Entry] = '-';
  }
  pBuffer[Entry] = '\0';
  for (Entry = 0; Entry < p->nLits; Entry = Entry + 1) {
    if (*(int *)(&p->field_0x14 + (long)Entry * 4) != -1) {
      iVar2 = Abc_LitIsCompl(*(int *)(&p->field_0x14 + (long)Entry * 4));
      cVar1 = '1';
      if (iVar2 != 0) {
        cVar1 = '0';
      }
      iVar2 = Abc_Lit2Var(*(int *)(&p->field_0x14 + (long)Entry * 4));
      pBuffer[iVar2] = cVar1;
    }
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    for (Entry = 0; iVar2 = Vec_IntSize(vFlopCounts), Entry < iVar2; Entry = Entry + 1) {
      iVar2 = Vec_IntEntry(vFlopCounts,Entry);
      if (iVar2 != 0) {
        pBuffer[local_38] = pBuffer[Entry];
        local_38 = local_38 + 1;
      }
    }
    pBuffer[local_38] = '\0';
  }
  Vec_StrPushBuffer(vStr,pBuffer,local_38);
  Vec_StrPush(vStr,' ');
  Vec_StrPush(vStr,'1');
  Vec_StrPush(vStr,'\n');
  if (pBuffer != (char *)0x0) {
    free(pBuffer);
  }
  return;
}

Assistant:

void Pdr_SetPrintStr( Vec_Str_t * vStr, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k = 0, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    Vec_StrPushBuffer( vStr, pBuff, k );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    ABC_FREE( pBuff );
}